

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Value fmt::internal::ArgArray<1u,true>::
      make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,fmt::BasicCStringRef<char>>
                (BasicCStringRef<char> *value)

{
  anon_union_16_12_986ea841_for_Value_0 aVar1;
  undefined8 *in_RDI;
  Value result;
  MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_> *in_stack_ffffffffffffffa8;
  undefined8 local_48;
  undefined8 uStack_40;
  
  MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_>::MakeValue
            (in_stack_ffffffffffffffa8,(char *)*in_RDI);
  aVar1.string.size = uStack_40;
  aVar1.long_long_value = local_48;
  return (anon_union_16_12_986ea841_for_Value_0)(anon_union_16_12_986ea841_for_Value_0)aVar1.string;
}

Assistant:

static Value make(const T &value) {
#ifdef __clang__
    Value result = MakeValue<Formatter>(value);
    // Workaround a bug in Apple LLVM version 4.2 (clang-425.0.28) of clang:
    // https://github.com/fmtlib/fmt/issues/276
    (void)result.custom.format;
    return result;
#else
    return MakeValue<Formatter>(value);
#endif
  }